

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

int cmsys::anon_unknown_3::GetFieldsFromFile<long_long>
              (char *fileName,char **fieldNames,longlong *values)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  int *piVar4;
  char *pcVar5;
  istringstream *piVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  char buf [1024];
  long *local_498 [2];
  long local_488 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_458;
  longlong *local_440;
  istringstream local_438 [120];
  ios_base local_3c0 [912];
  
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_440 = values;
  __stream = fopen64(fileName,"r");
  iVar3 = -1;
  if (__stream != (FILE *)0x0) {
    iVar11 = 0;
    memset(local_438,0,0x400);
    iVar2 = feof(__stream);
    bVar14 = true;
    if (iVar2 == 0) {
LAB_004c4775:
      iVar2 = ferror(__stream);
      if (iVar2 == 0) {
        piVar4 = __errno_location();
        *piVar4 = 0;
        pcVar5 = fgets((char *)local_438,0x400,__stream);
        if (pcVar5 != (char *)0x0) {
          piVar6 = local_438;
          do {
            if (*piVar6 == (istringstream)0xa) {
              *piVar6 = (istringstream)0x0;
            }
            else if (*piVar6 == (istringstream)0x0) goto LAB_004c47ed;
            piVar6 = piVar6 + 1;
          } while( true );
        }
        iVar2 = ferror(__stream);
        if ((iVar2 != 0) && (*piVar4 == 4)) {
          clearerr(__stream);
        }
        iVar2 = feof(__stream);
        if (iVar2 == 0) goto LAB_004c4775;
      }
      bVar14 = iVar11 == 0;
    }
LAB_004c484e:
    iVar2 = ferror(__stream);
    fclose(__stream);
    if (!(bool)(iVar2 != 0 | bVar14)) {
      lVar12 = 0;
      do {
        pcVar5 = fieldNames[lVar12];
        if (pcVar5 == (char *)0x0) {
          iVar3 = 0;
          break;
        }
        local_498[0] = local_488;
        sVar7 = strlen(pcVar5);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,pcVar5,pcVar5 + sVar7);
        bVar14 = (long)local_458.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_458.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start == 0;
        if (!bVar14) {
          uVar13 = (long)local_458.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_458.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          uVar10 = 0;
          lVar8 = std::__cxx11::string::find
                            ((char *)local_458.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,(ulong)local_498[0],0
                            );
          if (lVar8 == -1) {
            lVar8 = 0x20;
            uVar1 = 1;
            do {
              uVar10 = uVar1;
              if (uVar13 + (uVar13 == 0) == uVar10) {
                bVar14 = uVar13 <= uVar10;
                goto LAB_004c49c3;
              }
              lVar9 = std::__cxx11::string::find
                                ((char *)((long)&((local_458.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar8),(ulong)local_498[0],0);
              lVar8 = lVar8 + 0x20;
              uVar1 = uVar10 + 1;
            } while (lVar9 == -1);
            bVar14 = uVar13 <= uVar10;
          }
          else {
            bVar14 = false;
          }
          std::__cxx11::string::substr
                    ((ulong)&local_478,
                     (ulong)(local_458.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar10));
          std::__cxx11::istringstream::istringstream(local_438,(string *)&local_478,_S_in);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          std::istream::_M_extract<long_long>((longlong *)local_438);
          std::__cxx11::istringstream::~istringstream(local_438);
          std::ios_base::~ios_base(local_3c0);
        }
LAB_004c49c3:
        if (local_498[0] != local_488) {
          operator_delete(local_498[0],local_488[0] + 1);
        }
        iVar3 = -2 - (int)lVar12;
        lVar12 = lVar12 + 1;
      } while (!bVar14);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_458);
  return iVar3;
LAB_004c47ed:
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  sVar7 = strlen((char *)local_438);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,local_438,local_438 + sVar7);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_458,
             &local_478);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  iVar11 = iVar11 + 1;
  iVar2 = feof(__stream);
  bVar14 = false;
  if (iVar2 != 0) goto LAB_004c484e;
  goto LAB_004c4775;
}

Assistant:

int GetFieldsFromFile(
      const char *fileName,
      const char **fieldNames,
      T *values)
{
  kwsys_stl::vector<kwsys_stl::string> fields;
  if (!LoadLines(fileName,fields))
    {
    return -1;
    }
  int i=0;
  while (fieldNames[i]!=NULL)
    {
    int ierr=NameValue(fields,fieldNames[i],values[i]);
    if (ierr)
      {
      return -(i+2);
      }
    i+=1;
    }
  return 0;
}